

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O0

void printerror(int status)

{
  int iVar1;
  undefined1 local_98 [8];
  char errmsg [81];
  undefined1 local_38 [8];
  char status_str [31];
  int status_local;
  
  if (status != 0) {
    fprintf(_stderr,"\n*** Error occurred during program execution ***\n");
  }
  ffgerr(status,local_38);
  fprintf(_stderr,"\nstatus = %d: %s\n",(ulong)(uint)status,local_38);
  iVar1 = ffgmsg(local_98);
  if (iVar1 != 0) {
    fprintf(_stderr,"\nError message stack:\n");
    fprintf(_stderr," %s\n",local_98);
    while (iVar1 = ffgmsg(local_98), iVar1 != 0) {
      fprintf(_stderr," %s\n",local_98);
    }
  }
  exit(status);
}

Assistant:

void printerror( int status)
{
    /*****************************************************/
    /* Print out cfitsio error messages and exit program */
    /*****************************************************/

    char status_str[FLEN_STATUS], errmsg[FLEN_ERRMSG];
  
    if (status)
      fprintf(stderr, "\n*** Error occurred during program execution ***\n");

    fits_get_errstatus(status, status_str);   /* get the error description */
    fprintf(stderr, "\nstatus = %d: %s\n", status, status_str);

    /* get first message; null if stack is empty */
    if ( fits_read_errmsg(errmsg) ) 
    {
         fprintf(stderr, "\nError message stack:\n");
         fprintf(stderr, " %s\n", errmsg);

         while ( fits_read_errmsg(errmsg) )  /* get remaining messages */
             fprintf(stderr, " %s\n", errmsg);
    }

    exit( status );       /* terminate the program, returning error status */
}